

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

dictEntry * dictFind(dict *ht,void *key)

{
  uint uVar1;
  int iVar2;
  dictEntry *pdStack_28;
  uint h;
  dictEntry *he;
  void *key_local;
  dict *ht_local;
  
  if (ht->size != 0) {
    uVar1 = (*ht->type->hashFunction)(key);
    for (pdStack_28 = ht->table[uVar1 & (uint)ht->sizemask]; pdStack_28 != (dictEntry *)0x0;
        pdStack_28 = pdStack_28->next) {
      if (ht->type->keyCompare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
        if (key == pdStack_28->key) {
          return pdStack_28;
        }
      }
      else {
        iVar2 = (*ht->type->keyCompare)(ht->privdata,key,pdStack_28->key);
        if (iVar2 != 0) {
          return pdStack_28;
        }
      }
    }
  }
  return (dictEntry *)0x0;
}

Assistant:

static dictEntry *dictFind(dict *ht, const void *key) {
    dictEntry *he;
    unsigned int h;

    if (ht->size == 0) return NULL;
    h = dictHashKey(ht, key) & ht->sizemask;
    he = ht->table[h];
    while(he) {
        if (dictCompareHashKeys(ht, key, he->key))
            return he;
        he = he->next;
    }
    return NULL;
}